

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_setenv_ex
              (LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,uint value_len)

{
  uchar uVar1;
  LIBSSH2_SESSION *pLVar2;
  int iVar3;
  time_t start_time;
  uchar *puVar4;
  char *errmsg;
  ulong uVar5;
  uchar *s;
  ulong local_68;
  ulong local_60;
  packet_requirev_state_t *local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  uchar *data;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  local_50 = varname;
  local_48 = value;
  start_time = time((time_t *)0x0);
  uVar5 = (ulong)(varname_len + value_len + 0x15);
  local_58 = &channel->setenv_packet_requirev_state;
  local_68 = (ulong)value_len;
  local_60 = (ulong)varname_len;
  do {
    pLVar2 = channel->session;
    if (channel->setenv_state == libssh2_NB_state_idle) {
      channel->setenv_packet_len = uVar5;
      (channel->setenv_packet_requirev_state).start = 0;
      puVar4 = (uchar *)(*pLVar2->alloc)(uVar5,&pLVar2->abstract);
      channel->setenv_packet = puVar4;
      if (puVar4 != (uchar *)0x0) {
        s = puVar4 + 1;
        *puVar4 = 'b';
        _libssh2_store_u32(&s,(channel->remote).id);
        _libssh2_store_str(&s,"env",3);
        *s = '\x01';
        s = s + 1;
        _libssh2_store_str(&s,local_50,local_60);
        _libssh2_store_str(&s,local_48,local_68);
        channel->setenv_state = libssh2_NB_state_created;
        goto LAB_00121027;
      }
      iVar3 = -6;
      errmsg = "Unable to allocate memory for setenv packet";
      s = (uchar *)0x0;
LAB_001211b6:
      iVar3 = _libssh2_error(pLVar2,iVar3,errmsg);
    }
    else {
LAB_00121027:
      if (channel->setenv_state != libssh2_NB_state_created) {
LAB_001210a7:
        if (channel->setenv_state == libssh2_NB_state_sent) {
          iVar3 = _libssh2_packet_requirev
                            (pLVar2,"cd",&data,&local_40,1,channel->setenv_local_channel,4,local_58)
          ;
          if (iVar3 == -0x25) goto LAB_001211bd;
          if (iVar3 == 0) {
            if (local_40 != 0) {
              uVar1 = *data;
              (*pLVar2->free)(data,&pLVar2->abstract);
              if (uVar1 != 'c') goto LAB_00121121;
              channel->setenv_state = libssh2_NB_state_idle;
              iVar3 = 0;
              goto LAB_001211bd;
            }
            channel->setenv_state = libssh2_NB_state_idle;
            iVar3 = -0xe;
            errmsg = "Unexpected packet size";
          }
          else {
            channel->setenv_state = libssh2_NB_state_idle;
            errmsg = "Failed getting response for channel-setenv";
          }
        }
        else {
LAB_00121121:
          channel->setenv_state = libssh2_NB_state_idle;
          iVar3 = -0x16;
          errmsg = "Unable to complete request for channel-setenv";
        }
        goto LAB_001211b6;
      }
      iVar3 = _libssh2_transport_send
                        (pLVar2,channel->setenv_packet,channel->setenv_packet_len,(uchar *)0x0,0);
      if (iVar3 == 0) {
        (*pLVar2->free)(channel->setenv_packet,&pLVar2->abstract);
        channel->setenv_packet = (uchar *)0x0;
        _libssh2_htonu32(channel->setenv_local_channel,(channel->local).id);
        channel->setenv_state = libssh2_NB_state_sent;
        goto LAB_001210a7;
      }
      if (iVar3 != -0x25) {
        (*pLVar2->free)(channel->setenv_packet,&pLVar2->abstract);
        channel->setenv_packet = (uchar *)0x0;
        channel->setenv_state = libssh2_NB_state_idle;
        iVar3 = -7;
        errmsg = "Unable to send channel-request packet for setenv request";
        goto LAB_001211b6;
      }
      iVar3 = -0x25;
      _libssh2_error(pLVar2,-0x25,"Would block sending setenv request");
    }
LAB_001211bd:
    if (iVar3 != -0x25) {
      return iVar3;
    }
    pLVar2 = channel->session;
    if (pLVar2 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar2->api_block_mode == 0) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar2,start_time);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_channel_setenv_ex(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_setenv(channel, varname, varname_len,
                                value, value_len));
    return rc;
}